

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O3

void __thiscall btTriangleMesh::preallocateVertices(btTriangleMesh *this,int numverts)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btVector3 *ptr;
  float *ptr_00;
  undefined8 uVar3;
  btAlignedObjectArray<btVector3> *pbVar4;
  btVector3 *pbVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  
  if (this->m_use4componentVertices == true) {
    if (numverts <= (this->m_4componentVertices).m_capacity) {
      return;
    }
    if (numverts == 0) {
      pbVar5 = (btVector3 *)0x0;
    }
    else {
      pbVar5 = (btVector3 *)btAlignedAllocInternal((long)numverts << 4,0x10);
    }
    lVar7 = (long)(this->m_4componentVertices).m_size;
    if (0 < lVar7) {
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar8);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar5->m_floats + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 * 0x10 != lVar8);
    }
    ptr = (this->m_4componentVertices).m_data;
    if ((ptr != (btVector3 *)0x0) && ((this->m_4componentVertices).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr);
    }
    pbVar4 = &this->m_4componentVertices;
    (this->m_4componentVertices).m_ownsMemory = true;
    (this->m_4componentVertices).m_data = pbVar5;
    goto LAB_0016c5a7;
  }
  if (numverts <= (this->m_3componentVertices).m_capacity) {
    return;
  }
  if (numverts == 0) {
    pfVar6 = (float *)0x0;
  }
  else {
    pfVar6 = (float *)btAlignedAllocInternal((long)numverts << 2,0x10);
  }
  lVar7 = (long)(this->m_3componentVertices).m_size;
  ptr_00 = (this->m_3componentVertices).m_data;
  if (lVar7 < 1) {
    if (ptr_00 != (float *)0x0) goto LAB_0016c582;
  }
  else {
    lVar8 = 0;
    do {
      pfVar6[lVar8] = ptr_00[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
LAB_0016c582:
    if ((this->m_3componentVertices).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_00);
    }
  }
  pbVar4 = (btAlignedObjectArray<btVector3> *)&this->m_3componentVertices;
  (this->m_3componentVertices).m_ownsMemory = true;
  (this->m_3componentVertices).m_data = pfVar6;
LAB_0016c5a7:
  pbVar4->m_capacity = numverts;
  return;
}

Assistant:

void btTriangleMesh::preallocateVertices(int numverts)
{
	if (m_use4componentVertices)
	{
		m_4componentVertices.reserve(numverts);
	} else
	{
		m_3componentVertices.reserve(numverts);
	}
}